

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall
Assimp::ObjFileParser::parseFile(ObjFileParser *this,IOStreamBuffer<char> *streamBuffer)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  iterator iVar4;
  size_t sVar5;
  reference pcVar6;
  pointer pMVar7;
  pointer pMVar8;
  uint *puVar9;
  long lVar10;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var11;
  aiPrimitiveType local_1c0;
  int local_14c;
  string local_148 [32];
  long local_128;
  size_t nextSpace_1;
  char *local_118;
  char *local_110;
  undefined1 local_108 [8];
  string name_1;
  size_t nextSpace;
  undefined1 local_a8 [8];
  string name;
  undefined4 local_80;
  size_t dim;
  size_t numComponents;
  size_t filePos;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> buffer;
  size_t lastFilePos;
  uint processed;
  uint progressTotal;
  uint bytesToProcess;
  uint progressCounter;
  IOStreamBuffer<char> *streamBuffer_local;
  ObjFileParser *this_local;
  
  sVar3 = IOStreamBuffer<char>::size(streamBuffer);
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_48);
LAB_0070cedf:
  bVar2 = IOStreamBuffer<char>::getNextDataLine
                    (streamBuffer,(vector<char,_std::allocator<char>_> *)local_48,'\\');
  if (!bVar2) {
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_48);
    return;
  }
  iVar4 = std::vector<char,_std::allocator<char>_>::begin
                    ((vector<char,_std::allocator<char>_> *)local_48);
  (this->m_DataIt)._M_current = iVar4._M_current;
  iVar4 = std::vector<char,_std::allocator<char>_>::end
                    ((vector<char,_std::allocator<char>_> *)local_48);
  (this->m_DataItEnd)._M_current = iVar4._M_current;
  sVar5 = IOStreamBuffer<char>::getFilePos(streamBuffer);
  if ((ulong)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ < sVar5) {
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = sVar5;
    (*this->m_progress->_vptr_ProgressHandler[3])
              (this->m_progress,sVar5 & 0xffffffff,sVar3 & 0xffffffff);
  }
  pcVar6 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
           operator*(&this->m_DataIt);
  switch(*pcVar6) {
  case '#':
    getComment(this);
    goto LAB_0070cedf;
  default:
    break;
  case 'f':
  case 'l':
  case 'p':
    pcVar6 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&this->m_DataIt);
    if (*pcVar6 == 'f') {
      local_1c0 = aiPrimitiveType_POLYGON;
    }
    else {
      pcVar6 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&this->m_DataIt);
      local_1c0 = aiPrimitiveType_POINT;
      if (*pcVar6 == 'l') {
        local_1c0 = aiPrimitiveType_LINE;
      }
    }
    getFace(this,local_1c0);
    goto LAB_0070cedf;
  case 'g':
    getGroupName(this);
    goto LAB_0070cedf;
  case 'm':
    std::__cxx11::string::string((string *)local_108);
    local_110 = (this->m_DataIt)._M_current;
    local_118 = (this->m_DataItEnd)._M_current;
    nextSpace_1 = (size_t)getNameNoSpace<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                                    ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                      )local_110,
                                     (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                      )local_118,(string *)local_108);
    local_128 = std::__cxx11::string::find(local_108,0xb6ea90);
    if (local_128 != -1) {
      std::__cxx11::string::substr((ulong)local_148,(ulong)local_108);
      std::__cxx11::string::operator=((string *)local_108,local_148);
      std::__cxx11::string::~string(local_148);
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_108,"mg");
    if (bVar2) {
      getGroupNumberAndResolution(this);
LAB_0070d51e:
      local_14c = 0;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_108,"mtllib");
      if (bVar2) {
        getMaterialLib(this);
        goto LAB_0070d51e;
      }
      local_14c = 5;
    }
    std::__cxx11::string::~string((string *)local_108);
    if (local_14c == 0) goto LAB_0070cedf;
    break;
  case 'o':
    getObjectName(this);
    goto LAB_0070cedf;
  case 's':
    getGroupNumber(this);
    goto LAB_0070cedf;
  case 'u':
    std::__cxx11::string::string((string *)local_a8);
    getNameNoSpace<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               (this->m_DataIt)._M_current,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               (this->m_DataItEnd)._M_current,(string *)local_a8);
    lVar10 = std::__cxx11::string::find(local_a8,0xb6ea90);
    if (lVar10 != -1) {
      std::__cxx11::string::substr((ulong)((long)&name_1.field_2 + 8),(ulong)local_a8);
      std::__cxx11::string::operator=
                ((string *)local_a8,(string *)(name_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(name_1.field_2._M_local_buf + 8));
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a8,"usemtl");
    if (bVar2) {
      getMaterialDesc(this);
    }
    std::__cxx11::string::~string((string *)local_a8);
    goto LAB_0070cedf;
  case 'v':
    goto switchD_0070cff7_caseD_76;
  }
  _Var11 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                     ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
  (this->m_DataIt)._M_current = _Var11._M_current;
  goto LAB_0070cedf;
switchD_0070cff7_caseD_76:
  __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
            (&this->m_DataIt);
  pcVar6 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
           operator*(&this->m_DataIt);
  if ((*pcVar6 == ' ') ||
     (pcVar6 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&this->m_DataIt), *pcVar6 == '\t')) {
    sVar5 = getNumComponentsInDataDefinition(this);
    if (sVar5 == 3) {
      pMVar7 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      getVector3(this,&pMVar7->m_Vertices);
    }
    else if (sVar5 == 4) {
      pMVar7 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      getHomogeneousVector3(this,&pMVar7->m_Vertices);
    }
    else if (sVar5 == 6) {
      pMVar7 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      pMVar8 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      getTwoVectors3(this,&pMVar7->m_Vertices,&pMVar8->m_VertexColors);
    }
  }
  else {
    pcVar6 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&this->m_DataIt);
    if (*pcVar6 == 't') {
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                (&this->m_DataIt);
      pMVar7 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      sVar5 = getTexCoordVector(this,&pMVar7->m_TextureCoord);
      pMVar7 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      local_80 = (undefined4)sVar5;
      name.field_2._12_4_ = local_80;
      puVar9 = std::max<unsigned_int>
                         (&pMVar7->m_TextureCoordDim,(uint *)(name.field_2._M_local_buf + 0xc));
      uVar1 = *puVar9;
      pMVar7 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      pMVar7->m_TextureCoordDim = uVar1;
    }
    else {
      pcVar6 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&this->m_DataIt);
      if (*pcVar6 == 'n') {
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                  (&this->m_DataIt);
        pMVar7 = std::
                 unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
                 operator->(&this->m_pModel);
        getVector3(this,&pMVar7->m_Normals);
      }
    }
  }
  goto LAB_0070cedf;
}

Assistant:

void ObjFileParser::parseFile( IOStreamBuffer<char> &streamBuffer ) {
    // only update every 100KB or it'll be too slow
    //const unsigned int updateProgressEveryBytes = 100 * 1024;
    unsigned int progressCounter = 0;
    const unsigned int bytesToProcess = static_cast<unsigned int>(streamBuffer.size());
    const unsigned int progressTotal = bytesToProcess;
    unsigned int processed = 0;
    size_t lastFilePos( 0 );

    std::vector<char> buffer;
    while ( streamBuffer.getNextDataLine( buffer, '\\' ) ) {
        m_DataIt = buffer.begin();
        m_DataItEnd = buffer.end();

        // Handle progress reporting
        const size_t filePos( streamBuffer.getFilePos() );
        if ( lastFilePos < filePos ) {
            processed = static_cast<unsigned int>(filePos);
            lastFilePos = filePos;
            progressCounter++;
            m_progress->UpdateFileRead( processed, progressTotal );
        }

        // parse line
        switch (*m_DataIt) {
        case 'v': // Parse a vertex texture coordinate
            {
                ++m_DataIt;
                if (*m_DataIt == ' ' || *m_DataIt == '\t') {
                    size_t numComponents = getNumComponentsInDataDefinition();
                    if (numComponents == 3) {
                        // read in vertex definition
                        getVector3(m_pModel->m_Vertices);
                    } else if (numComponents == 4) {
                        // read in vertex definition (homogeneous coords)
                        getHomogeneousVector3(m_pModel->m_Vertices);
                    } else if (numComponents == 6) {
                        // read vertex and vertex-color
                        getTwoVectors3(m_pModel->m_Vertices, m_pModel->m_VertexColors);
                    }
                } else if (*m_DataIt == 't') {
                    // read in texture coordinate ( 2D or 3D )
                    ++m_DataIt;
                    size_t dim = getTexCoordVector(m_pModel->m_TextureCoord);
                    m_pModel->m_TextureCoordDim = std::max(m_pModel->m_TextureCoordDim, (unsigned int)dim);
                } else if (*m_DataIt == 'n') {
                    // Read in normal vector definition
                    ++m_DataIt;
                    getVector3( m_pModel->m_Normals );
                }
            }
            break;

        case 'p': // Parse a face, line or point statement
        case 'l':
        case 'f':
            {
                getFace(*m_DataIt == 'f' ? aiPrimitiveType_POLYGON : (*m_DataIt == 'l'
                    ? aiPrimitiveType_LINE : aiPrimitiveType_POINT));
            }
            break;

        case '#': // Parse a comment
            {
                getComment();
            }
            break;

        case 'u': // Parse a material desc. setter
            {
                std::string name;

                getNameNoSpace(m_DataIt, m_DataItEnd, name);

                size_t nextSpace = name.find(" ");
                if (nextSpace != std::string::npos)
                    name = name.substr(0, nextSpace);

                if(name == "usemtl")
                {
                    getMaterialDesc();
                }
            }
            break;

        case 'm': // Parse a material library or merging group ('mg')
            {
                std::string name;

                getNameNoSpace(m_DataIt, m_DataItEnd, name);

                size_t nextSpace = name.find(" ");
                if (nextSpace != std::string::npos)
                    name = name.substr(0, nextSpace);

                if (name == "mg")
                    getGroupNumberAndResolution();
                else if(name == "mtllib")
                    getMaterialLib();
				else
					goto pf_skip_line;
            }
            break;

        case 'g': // Parse group name
            {
                getGroupName();
            }
            break;

        case 's': // Parse group number
            {
                getGroupNumber();
            }
            break;

        case 'o': // Parse object name
            {
                getObjectName();
            }
            break;

        default:
            {
pf_skip_line:
                m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
            }
            break;
        }
    }
}